

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O2

wchar_t fl_utf8encode(uint ucs,char *buf)

{
  wchar_t wVar1;
  byte bVar2;
  
  bVar2 = (byte)ucs;
  if (ucs < 0x80) {
    *buf = bVar2;
    wVar1 = L'\x01';
  }
  else if (ucs < 0x800) {
    *buf = (byte)(ucs >> 6) | 0xc0;
    buf[1] = bVar2 & 0x3f | 0x80;
    wVar1 = L'\x02';
  }
  else {
    if (ucs < 0x10000) {
      *buf = (byte)(ucs >> 0xc) | 0xe0;
      buf[1] = (byte)(ucs >> 6) & 0x3f | 0x80;
      buf[2] = bVar2 & 0x3f | 0x80;
    }
    else {
      if (ucs < 0x110000) {
        *buf = (byte)(ucs >> 0x12) | 0xf0;
        buf[1] = (byte)(ucs >> 0xc) & 0x3f | 0x80;
        buf[2] = (byte)(ucs >> 6) & 0x3f | 0x80;
        buf[3] = bVar2 & 0x3f | 0x80;
        return L'\x04';
      }
      buf[0] = -0x11;
      buf[1] = -0x41;
      buf[2] = -0x43;
    }
    wVar1 = L'\x03';
  }
  return wVar1;
}

Assistant:

int fl_utf8encode(unsigned ucs, char* buf) {
  if (ucs < 0x000080U) {
    buf[0] = ucs;
    return 1;
  } else if (ucs < 0x000800U) {
    buf[0] = 0xc0 | (ucs >> 6);
    buf[1] = 0x80 | (ucs & 0x3F);
    return 2;
  } else if (ucs < 0x010000U) {
    buf[0] = 0xe0 | (ucs >> 12);
    buf[1] = 0x80 | ((ucs >> 6) & 0x3F);
    buf[2] = 0x80 | (ucs & 0x3F);
    return 3;
  } else if (ucs <= 0x0010ffffU) {
    buf[0] = 0xf0 | (ucs >> 18);
    buf[1] = 0x80 | ((ucs >> 12) & 0x3F);
    buf[2] = 0x80 | ((ucs >> 6) & 0x3F);
    buf[3] = 0x80 | (ucs & 0x3F);
    return 4;
  } else {
    /* encode 0xfffd: */
    buf[0] = (char)0xef;
    buf[1] = (char)0xbf;
    buf[2] = (char)0xbd;
    return 3;
  }
}